

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacintoshIMG.cpp
# Opt level: O1

void __thiscall
Storage::Disk::MacintoshIMG::construct_raw_gcr(MacintoshIMG *this,size_t offset,size_t size)

{
  stat *psVar1;
  undefined4 *puVar2;
  size_t in_RCX;
  void *__buf;
  FILE *local_38;
  size_type local_28;
  
  this->is_diskCopy_file_ = false;
  if (size == 0) {
    psVar1 = FileHolder::stats(&this->file_);
    size = psVar1->st_size;
  }
  if ((size != 0x64000) && (size != 0xc8000)) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0xfffffffe;
    __cxa_throw(puVar2,&Error::typeinfo,0);
  }
  this->raw_offset_ = offset;
  FileHolder::seek(&this->file_,offset,0);
  if (size == 0xc8000) {
    this->encoding_ = GCR800;
    this->format_ = '\"';
    __buf = (void *)0xc8000;
  }
  else {
    this->encoding_ = GCR400;
    this->format_ = '\x02';
    __buf = (void *)0x64000;
  }
  FileHolder::read((FileHolder *)&stack0xffffffffffffffc8,(int)&this->file_,__buf,in_RCX);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->data_,&stack0xffffffffffffffc8);
  if (local_38 != (FILE *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return;
}

Assistant:

void MacintoshIMG::construct_raw_gcr(size_t offset, size_t size) {
	is_diskCopy_file_ = false;
	if(size == 0) {
		size = size_t(file_.stats().st_size);
	}
	if(size != 819200 && size != 409600)
		throw Error::InvalidFormat;

	raw_offset_ = long(offset);
	file_.seek(raw_offset_, SEEK_SET);
	if(size == 819200) {
		encoding_ = Encoding::GCR800;
		format_ = 0x22;
		data_ = file_.read(819200);
	} else {
		encoding_ = Encoding::GCR400;
		format_ = 0x02;
		data_ = file_.read(409600);
	}
}